

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  float **ppfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  Geometry *pGVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  undefined4 uVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  undefined1 auVar26 [8];
  int *extraout_RAX;
  ulong uVar28;
  RTCRayQueryContext *pRVar29;
  ulong uVar30;
  RayHit *pRVar31;
  ulong uVar32;
  int *piVar33;
  ulong uVar34;
  uint *puVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  float fVar55;
  float fVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar83;
  float fVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar85;
  float fVar88;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar89;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  undefined1 auVar95 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar97 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  int local_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  undefined8 local_1268;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [8];
  uint uStack_1230;
  uint uStack_122c;
  ulong local_1220;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  RayQueryContext *local_1200;
  RTCFilterFunctionNArguments local_11f8;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float local_11b4;
  float local_11b0;
  float local_11ac;
  undefined4 local_11a8;
  undefined4 local_11a4;
  uint local_11a0;
  uint local_119c;
  uint local_1198;
  Scene *local_1180;
  undefined8 local_1178;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1108 [16];
  float local_10f8 [4];
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8 [4];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8 [4];
  float local_10a8 [4];
  long local_1098;
  long local_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  uint local_1078;
  uint uStack_1074;
  uint uStack_1070;
  uint uStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined8 local_fb8;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  int *piVar27;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar24 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar89 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar117 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar85 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar110 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar92 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar119 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar88 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar112 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar93 = 0.0;
    if (0.0 <= fVar110) {
      fVar93 = fVar110;
    }
    fVar110 = (ray->super_RayK<1>).tfar;
    fVar121 = 0.0;
    if (0.0 <= fVar110) {
      fVar121 = fVar110;
    }
    uVar38 = -(uint)((float)DAT_01f80d30 <= ABS(fVar92));
    uVar39 = -(uint)(DAT_01f80d30._4_4_ <= ABS(fVar119));
    uVar40 = -(uint)(DAT_01f80d30._8_4_ <= ABS(fVar88));
    uVar41 = -(uint)(DAT_01f80d30._12_4_ <= ABS(fVar112));
    auVar58._0_4_ = (uint)fVar92 & uVar38;
    auVar58._4_4_ = (uint)fVar119 & uVar39;
    auVar58._8_4_ = (uint)fVar88 & uVar40;
    auVar58._12_4_ = (uint)fVar112 & uVar41;
    auVar66._0_4_ = ~uVar38 & (uint)(float)DAT_01f80d30;
    auVar66._4_4_ = ~uVar39 & (uint)DAT_01f80d30._4_4_;
    auVar66._8_4_ = ~uVar40 & (uint)DAT_01f80d30._8_4_;
    auVar66._12_4_ = ~uVar41 & (uint)DAT_01f80d30._12_4_;
    auVar66 = auVar66 | auVar58;
    auVar58 = rcpps(auVar58,auVar66);
    fVar106 = auVar58._0_4_;
    fVar107 = auVar58._4_4_;
    fVar108 = auVar58._8_4_;
    fVar106 = (1.0 - auVar66._0_4_ * fVar106) * fVar106 + fVar106;
    fVar107 = (1.0 - auVar66._4_4_ * fVar107) * fVar107 + fVar107;
    fVar108 = (1.0 - auVar66._8_4_ * fVar108) * fVar108 + fVar108;
    uVar34 = (ulong)(fVar106 < 0.0) * 0x10;
    uVar32 = (ulong)(fVar107 < 0.0) << 4 | 0x20;
    uVar37 = (ulong)(fVar108 < 0.0) << 4 | 0x40;
    uVar36 = uVar32 ^ 0x10;
    _local_1078 = mm_lookupmask_ps._240_8_;
    _uStack_1070 = mm_lookupmask_ps._248_8_;
    local_1220 = uVar32;
    local_1200 = context;
    local_1008 = fVar85;
    fStack_1004 = fVar85;
    fStack_1000 = fVar85;
    fStack_ffc = fVar85;
    local_1018 = fVar93;
    fStack_1014 = fVar93;
    fStack_1010 = fVar93;
    fStack_100c = fVar93;
    local_1028 = fVar108;
    fStack_1024 = fVar108;
    fStack_1020 = fVar108;
    fStack_101c = fVar108;
    local_1038 = fVar89;
    fStack_1034 = fVar89;
    fStack_1030 = fVar89;
    fStack_102c = fVar89;
    local_1048 = fVar117;
    fStack_1044 = fVar117;
    fStack_1040 = fVar117;
    fStack_103c = fVar117;
    local_1058 = fVar106;
    fStack_1054 = fVar106;
    fStack_1050 = fVar106;
    fStack_104c = fVar106;
    local_1068 = fVar107;
    fStack_1064 = fVar107;
    fStack_1060 = fVar107;
    fStack_105c = fVar107;
    fVar102 = fVar107;
    fVar101 = fVar107;
    fVar100 = fVar107;
    fVar99 = fVar106;
    fVar98 = fVar106;
    fVar96 = fVar106;
    fVar57 = fVar117;
    fVar56 = fVar117;
    fVar55 = fVar117;
    fVar46 = fVar89;
    fVar44 = fVar89;
    fVar43 = fVar89;
    fVar42 = fVar108;
    fVar84 = fVar108;
    fVar105 = fVar108;
    fVar83 = fVar93;
    fVar75 = fVar93;
    fVar123 = fVar93;
    fVar94 = fVar85;
    fVar112 = fVar85;
    fVar88 = fVar85;
    fVar119 = fVar121;
    fVar92 = fVar121;
    fVar110 = fVar121;
LAB_00d0dd61:
    do {
      pauVar21 = pauVar24 + -1;
      pauVar24 = pauVar24 + -1;
      pfVar8 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar21 + 8) < *pfVar8 || *(float *)((long)*pauVar21 + 8) == *pfVar8) {
        uVar30 = *(ulong *)*pauVar24;
        pRVar31 = ray;
        while ((uVar30 & 8) == 0) {
          pfVar8 = (float *)(uVar30 + 0x20 + uVar34);
          auVar91._0_4_ = (*pfVar8 - fVar43) * fVar96;
          auVar91._4_4_ = (pfVar8[1] - fVar44) * fVar98;
          auVar91._8_4_ = (pfVar8[2] - fVar46) * fVar99;
          auVar91._12_4_ = (pfVar8[3] - fVar89) * fVar106;
          pfVar8 = (float *)(uVar30 + 0x20 + uVar32);
          auVar59._0_4_ = (*pfVar8 - fVar55) * fVar100;
          auVar59._4_4_ = (pfVar8[1] - fVar56) * fVar101;
          auVar59._8_4_ = (pfVar8[2] - fVar57) * fVar102;
          auVar59._12_4_ = (pfVar8[3] - fVar117) * fVar107;
          auVar58 = maxps(auVar91,auVar59);
          pfVar8 = (float *)(uVar30 + 0x20 + uVar37);
          auVar60._0_4_ = (*pfVar8 - fVar88) * fVar105;
          auVar60._4_4_ = (pfVar8[1] - fVar112) * fVar84;
          auVar60._8_4_ = (pfVar8[2] - fVar94) * fVar42;
          auVar60._12_4_ = (pfVar8[3] - fVar85) * fVar108;
          auVar87._4_4_ = fVar75;
          auVar87._0_4_ = fVar123;
          auVar87._8_4_ = fVar83;
          auVar87._12_4_ = fVar93;
          auVar66 = maxps(auVar60,auVar87);
          _local_1158 = maxps(auVar58,auVar66);
          pfVar8 = (float *)(uVar30 + 0x20 + (uVar34 ^ 0x10));
          auVar61._0_4_ = (*pfVar8 - fVar43) * fVar96;
          auVar61._4_4_ = (pfVar8[1] - fVar44) * fVar98;
          auVar61._8_4_ = (pfVar8[2] - fVar46) * fVar99;
          auVar61._12_4_ = (pfVar8[3] - fVar89) * fVar106;
          pfVar8 = (float *)(uVar30 + 0x20 + uVar36);
          auVar67._0_4_ = (*pfVar8 - fVar55) * fVar100;
          auVar67._4_4_ = (pfVar8[1] - fVar56) * fVar101;
          auVar67._8_4_ = (pfVar8[2] - fVar57) * fVar102;
          auVar67._12_4_ = (pfVar8[3] - fVar117) * fVar107;
          auVar58 = minps(auVar61,auVar67);
          pfVar8 = (float *)(uVar30 + 0x20 + (uVar37 ^ 0x10));
          auVar68._0_4_ = (*pfVar8 - fVar88) * fVar105;
          auVar68._4_4_ = (pfVar8[1] - fVar112) * fVar84;
          auVar68._8_4_ = (pfVar8[2] - fVar94) * fVar42;
          auVar68._12_4_ = (pfVar8[3] - fVar85) * fVar108;
          auVar79._4_4_ = fVar92;
          auVar79._0_4_ = fVar110;
          auVar79._8_4_ = fVar119;
          auVar79._12_4_ = fVar121;
          auVar66 = minps(auVar68,auVar79);
          auVar58 = minps(auVar58,auVar66);
          auVar47._4_4_ = -(uint)(local_1158._4_4_ <= auVar58._4_4_);
          auVar47._0_4_ = -(uint)(local_1158._0_4_ <= auVar58._0_4_);
          auVar47._8_4_ = -(uint)(local_1158._8_4_ <= auVar58._8_4_);
          auVar47._12_4_ = -(uint)(local_1158._12_4_ <= auVar58._12_4_);
          uVar38 = movmskps((int)pRVar31,auVar47);
          if (uVar38 == 0) {
            if (pauVar24 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d0dd61;
          }
          uVar38 = uVar38 & 0xff;
          pRVar31 = (RayHit *)(ulong)uVar38;
          uVar28 = uVar30 & 0xfffffffffffffff0;
          lVar17 = 0;
          if (pRVar31 != (RayHit *)0x0) {
            for (; (uVar38 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar30 = *(ulong *)(uVar28 + lVar17 * 8);
          uVar38 = uVar38 - 1 & uVar38;
          if (uVar38 != 0) {
            uVar39 = *(uint *)(local_1158 + lVar17 * 4);
            lVar17 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            uVar10 = *(ulong *)(uVar28 + lVar17 * 8);
            uVar40 = *(uint *)(local_1158 + lVar17 * 4);
            uVar38 = uVar38 - 1 & uVar38;
            uVar32 = local_1220;
            if (uVar38 == 0) {
              pRVar31 = (RayHit *)(ulong)uVar39;
              if (uVar39 < uVar40) {
                *(ulong *)*pauVar24 = uVar10;
                *(uint *)((long)*pauVar24 + 8) = uVar40;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(ulong *)*pauVar24 = uVar30;
                *(uint *)((long)*pauVar24 + 8) = uVar39;
                pauVar24 = pauVar24 + 1;
                uVar30 = uVar10;
              }
            }
            else {
              auVar48._8_4_ = uVar39;
              auVar48._0_8_ = uVar30;
              auVar48._12_4_ = 0;
              auVar62._8_4_ = uVar40;
              auVar62._0_8_ = uVar10;
              auVar62._12_4_ = 0;
              lVar17 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar30 = *(ulong *)(uVar28 + lVar17 * 8);
              iVar22 = *(int *)(local_1158 + lVar17 * 4);
              auVar69._8_4_ = iVar22;
              auVar69._0_8_ = uVar30;
              auVar69._12_4_ = 0;
              auVar76._8_4_ = -(uint)((int)uVar39 < (int)uVar40);
              uVar38 = uVar38 - 1 & uVar38;
              if (uVar38 == 0) {
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar58 = auVar48 & auVar76 | ~auVar76 & auVar62;
                auVar66 = auVar62 & auVar76 | ~auVar76 & auVar48;
                auVar77._8_4_ = -(uint)(auVar58._8_4_ < iVar22);
                auVar77._0_8_ = CONCAT44(auVar77._8_4_,auVar77._8_4_);
                auVar77._12_4_ = auVar77._8_4_;
                uVar30 = ~auVar77._0_8_ & uVar30 | auVar58._0_8_ & auVar77._0_8_;
                auVar58 = auVar69 & auVar77 | ~auVar77 & auVar58;
                auVar49._8_4_ = -(uint)(auVar66._8_4_ < auVar58._8_4_);
                auVar49._4_4_ = auVar49._8_4_;
                auVar49._0_4_ = auVar49._8_4_;
                auVar49._12_4_ = auVar49._8_4_;
                *pauVar24 = ~auVar49 & auVar66 | auVar58 & auVar49;
                pauVar24[1] = auVar66 & auVar49 | ~auVar49 & auVar58;
                pauVar24 = pauVar24 + 2;
                pRVar31 = (RayHit *)(ulong)uVar38;
              }
              else {
                pRVar31 = (RayHit *)0x0;
                if ((RayHit *)(ulong)uVar38 != (RayHit *)0x0) {
                  for (; (uVar38 >> (long)pRVar31 & 1) == 0;
                      pRVar31 = (RayHit *)((long)(pRVar31->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                iVar9 = *(int *)(local_1158 + (long)pRVar31 * 4);
                auVar86._8_4_ = iVar9;
                auVar86._0_8_ = *(undefined8 *)(uVar28 + (long)pRVar31 * 8);
                auVar86._12_4_ = 0;
                auVar78._4_4_ = auVar76._8_4_;
                auVar78._0_4_ = auVar76._8_4_;
                auVar78._8_4_ = auVar76._8_4_;
                auVar78._12_4_ = auVar76._8_4_;
                auVar58 = auVar48 & auVar78 | ~auVar78 & auVar62;
                auVar66 = auVar62 & auVar78 | ~auVar78 & auVar48;
                auVar90._0_4_ = -(uint)(iVar22 < iVar9);
                auVar90._4_4_ = -(uint)(iVar22 < iVar9);
                auVar90._8_4_ = -(uint)(iVar22 < iVar9);
                auVar90._12_4_ = -(uint)(iVar22 < iVar9);
                auVar79 = auVar69 & auVar90 | ~auVar90 & auVar86;
                auVar91 = ~auVar90 & auVar69 | auVar86 & auVar90;
                auVar70._8_4_ = -(uint)(auVar66._8_4_ < auVar91._8_4_);
                auVar70._4_4_ = auVar70._8_4_;
                auVar70._0_4_ = auVar70._8_4_;
                auVar70._12_4_ = auVar70._8_4_;
                auVar87 = auVar66 & auVar70 | ~auVar70 & auVar91;
                auVar63._8_4_ = -(uint)(auVar58._8_4_ < auVar79._8_4_);
                auVar63._0_8_ = CONCAT44(auVar63._8_4_,auVar63._8_4_);
                auVar63._12_4_ = auVar63._8_4_;
                uVar30 = auVar58._0_8_ & auVar63._0_8_ | ~auVar63._0_8_ & auVar79._0_8_;
                auVar58 = ~auVar63 & auVar58 | auVar79 & auVar63;
                auVar50._8_4_ = -(uint)(auVar58._8_4_ < auVar87._8_4_);
                auVar50._4_4_ = auVar50._8_4_;
                auVar50._0_4_ = auVar50._8_4_;
                auVar50._12_4_ = auVar50._8_4_;
                *pauVar24 = ~auVar70 & auVar66 | auVar91 & auVar70;
                pauVar24[1] = ~auVar50 & auVar58 | auVar87 & auVar50;
                pauVar24[2] = auVar58 & auVar50 | ~auVar50 & auVar87;
                pauVar24 = pauVar24 + 3;
              }
            }
          }
        }
        local_1098 = (ulong)((uint)uVar30 & 0xf) - 8;
        if (local_1098 != 0) {
          local_1090 = 0;
          do {
            lVar25 = local_1090 * 0x60;
            puVar1 = (uint *)((uVar30 & 0xfffffffffffffff0) + lVar25);
            puVar35 = puVar1 + 0x10;
            ppfVar11 = (context->scene->vertices).items;
            pfVar12 = ppfVar11[*puVar35];
            pfVar8 = pfVar12 + *puVar1;
            fVar89 = *pfVar8;
            fVar117 = pfVar8[1];
            local_fe8 = pfVar8[2];
            pfVar8 = pfVar12 + puVar1[4];
            pfVar2 = pfVar12 + puVar1[8];
            fVar85 = *pfVar2;
            fVar110 = pfVar2[1];
            pfVar12 = pfVar12 + puVar1[0xc];
            pfVar13 = ppfVar11[puVar1[0x11]];
            pfVar3 = pfVar13 + puVar1[1];
            fVar92 = *pfVar3;
            fVar119 = pfVar3[1];
            fStack_fe4 = pfVar3[2];
            pfVar3 = pfVar13 + puVar1[5];
            pfVar4 = pfVar13 + puVar1[9];
            fVar88 = *pfVar4;
            fVar112 = pfVar4[1];
            pfVar13 = pfVar13 + puVar1[0xd];
            pfVar14 = ppfVar11[puVar1[0x12]];
            pfVar5 = pfVar14 + puVar1[2];
            fVar93 = *pfVar5;
            fVar121 = pfVar5[1];
            fStack_fe0 = pfVar5[2];
            pfVar5 = pfVar14 + puVar1[6];
            uVar19 = *(undefined8 *)(pfVar14 + puVar1[10]);
            uStack_1250 = *(undefined8 *)(pfVar14 + puVar1[10] + 2);
            uVar20 = *(undefined8 *)(pfVar14 + puVar1[0xe]);
            pfVar15 = ppfVar11[puVar1[0x13]];
            pfVar6 = pfVar15 + puVar1[3];
            fVar94 = *pfVar6;
            fVar123 = pfVar6[1];
            fStack_fdc = pfVar6[2];
            pfVar6 = pfVar15 + puVar1[7];
            fVar75 = (pfVar15 + puVar1[0xb])[1];
            pfVar7 = pfVar15 + puVar1[0xf];
            local_1258._0_4_ = (float)uVar19;
            uVar23 = (float)local_1258;
            local_1258._4_4_ = (float)((ulong)uVar19 >> 0x20);
            fVar84 = local_1258._4_4_;
            local_1258 = (int *)CONCAT44(pfVar4[2],pfVar2[2]);
            local_1248 = CONCAT44(fVar88,fVar85);
            local_1238._4_4_ = pfVar15[puVar1[0xb]];
            local_1238._0_4_ = uVar23;
            local_11c8 = (Scene *)CONCAT44(fVar112,fVar110);
            fStack_11c0 = fVar84;
            fStack_11bc = fVar75;
            local_1298 = (float)uVar20;
            fStack_1294 = (float)((ulong)uVar20 >> 0x20);
            fStack_1290 = (float)*(undefined8 *)(pfVar14 + puVar1[0xe] + 2);
            fStack_fa0 = pfVar5[1];
            fStack_f9c = pfVar6[1];
            fVar42 = fVar117 - pfVar8[1];
            fVar108 = fVar119 - pfVar3[1];
            fVar43 = fVar121 - pfVar5[1];
            fVar44 = fVar123 - pfVar6[1];
            local_f98 = CONCAT44(pfVar3[2],pfVar8[2]);
            fVar125 = local_fe8 - pfVar8[2];
            fVar126 = fStack_fe4 - pfVar3[2];
            fVar127 = fStack_fe0 - pfVar5[2];
            fVar128 = fStack_fdc - pfVar6[2];
            local_fc8 = pfVar12[1];
            fStack_fc4 = pfVar13[1];
            fStack_fc0 = fStack_1294;
            fStack_fbc = pfVar7[1];
            fVar109 = pfVar12[1] - fVar117;
            fVar111 = pfVar13[1] - fVar119;
            fStack_1294 = fStack_1294 - fVar121;
            fVar113 = pfVar7[1] - fVar123;
            local_fb8 = CONCAT44(pfVar13[2],pfVar12[2]);
            local_fa8 = fStack_1290;
            fStack_fa4 = pfVar7[2];
            fVar114 = pfVar12[2] - local_fe8;
            fVar115 = pfVar13[2] - fStack_fe4;
            fStack_1290 = fStack_1290 - fStack_fe0;
            fVar116 = pfVar7[2] - fStack_fdc;
            local_10c8._0_4_ = fVar125 * fVar109 - fVar42 * fVar114;
            local_10c8._4_4_ = fVar126 * fVar111 - fVar108 * fVar115;
            fStack_10c0 = fVar127 * fStack_1294 - fVar43 * fStack_1290;
            fStack_10bc = fVar128 * fVar113 - fVar44 * fVar116;
            local_fd8 = *pfVar12;
            fStack_fd4 = *pfVar13;
            fStack_fd0 = local_1298;
            fStack_fcc = *pfVar7;
            fVar100 = *pfVar12 - fVar89;
            fVar101 = *pfVar13 - fVar92;
            local_1298 = local_1298 - fVar93;
            fVar102 = *pfVar7 - fVar94;
            fStack_1210 = (ray->super_RayK<1>).org.field_0.m128[0];
            fStack_1260 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar83 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_1278 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_1170 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar105 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1218 = (RTCIntersectArguments *)CONCAT44(fStack_1210,fStack_1210);
            fStack_120c = fStack_1210;
            local_ff8 = fVar89 - fStack_1210;
            fStack_ff4 = fVar92 - fStack_1210;
            fStack_ff0 = fVar93 - fStack_1210;
            fStack_fec = fVar94 - fStack_1210;
            local_1268 = (Geometry *)CONCAT44(fStack_1260,fStack_1260);
            fStack_125c = fStack_1260;
            fVar117 = fVar117 - fStack_1260;
            fVar119 = fVar119 - fStack_1260;
            fVar121 = fVar121 - fStack_1260;
            fVar123 = fVar123 - fStack_1260;
            fVar96 = local_ff8 * fStack_1170 - fVar117 * local_1278;
            fVar98 = fStack_ff4 * fStack_1170 - fVar119 * local_1278;
            fVar99 = fStack_ff0 * fStack_1170 - fVar121 * local_1278;
            fVar106 = fStack_fec * fStack_1170 - fVar123 * local_1278;
            local_f88 = *pfVar8;
            fStack_f84 = *pfVar3;
            fStack_f80 = *pfVar5;
            fStack_f7c = *pfVar6;
            fVar89 = fVar89 - *pfVar8;
            fVar92 = fVar92 - *pfVar3;
            fVar93 = fVar93 - *pfVar5;
            fVar94 = fVar94 - *pfVar6;
            local_10b8[0] = fVar89 * fVar114 - fVar125 * fVar100;
            local_10b8[1] = fVar92 * fVar115 - fVar126 * fVar101;
            local_10b8[2] = fVar93 * fStack_1290 - fVar127 * local_1298;
            local_10b8[3] = fVar94 * fVar116 - fVar128 * fVar102;
            local_1168._4_4_ = fVar105;
            local_1168._0_4_ = fVar105;
            fStack_1160 = fVar105;
            fStack_115c = fVar105;
            local_1088 = fVar83;
            fStack_1084 = fVar83;
            fStack_1080 = fVar83;
            fStack_107c = fVar83;
            local_fe8 = local_fe8 - fVar83;
            fStack_fe4 = fStack_fe4 - fVar83;
            fStack_fe0 = fStack_fe0 - fVar83;
            fStack_fdc = fStack_fdc - fVar83;
            fVar46 = local_fe8 * local_1278 - local_ff8 * fVar105;
            fVar55 = fStack_fe4 * local_1278 - fStack_ff4 * fVar105;
            fVar56 = fStack_fe0 * local_1278 - fStack_ff0 * fVar105;
            fVar57 = fStack_fdc * local_1278 - fStack_fec * fVar105;
            local_10a8[0] = fVar42 * fVar100 - fVar89 * fVar109;
            local_10a8[1] = fVar108 * fVar101 - fVar92 * fVar111;
            local_10a8[2] = fVar43 * local_1298 - fVar93 * fStack_1294;
            local_10a8[3] = fVar44 * fVar102 - fVar94 * fVar113;
            fVar118 = fVar117 * fVar105 - local_fe8 * fStack_1170;
            fVar120 = fVar119 * fVar105 - fStack_fe4 * fStack_1170;
            fVar122 = fVar121 * fVar105 - fStack_fe0 * fStack_1170;
            fVar124 = fVar123 * fVar105 - fStack_fdc * fStack_1170;
            local_1178 = (Geometry *)CONCAT44(fStack_1170,fStack_1170);
            fStack_116c = fStack_1170;
            fStack_1274 = local_1278;
            fStack_1270 = local_1278;
            fStack_126c = local_1278;
            fVar107 = (float)local_10c8._0_4_ * local_1278 +
                      local_10b8[0] * fStack_1170 + local_10a8[0] * fVar105;
            fVar103 = (float)local_10c8._4_4_ * local_1278 +
                      local_10b8[1] * fStack_1170 + local_10a8[1] * fVar105;
            fVar104 = fStack_10c0 * local_1278 +
                      local_10b8[2] * fStack_1170 + local_10a8[2] * fVar105;
            fVar105 = fStack_10bc * local_1278 +
                      local_10b8[3] * fStack_1170 + local_10a8[3] * fVar105;
            uVar38 = (uint)fVar107 & 0x80000000;
            uVar39 = (uint)fVar103 & 0x80000000;
            uVar40 = (uint)fVar104 & 0x80000000;
            uVar41 = (uint)fVar105 & 0x80000000;
            local_1158._0_4_ =
                 (uint)(fVar100 * fVar118 + fVar109 * fVar46 + fVar114 * fVar96) ^ uVar38;
            local_1158._4_4_ =
                 (uint)(fVar101 * fVar120 + fVar111 * fVar55 + fVar115 * fVar98) ^ uVar39;
            fStack_1150 = (float)((uint)(local_1298 * fVar122 +
                                        fStack_1294 * fVar56 + fStack_1290 * fVar99) ^ uVar40);
            fStack_114c = (float)((uint)(fVar102 * fVar124 + fVar113 * fVar57 + fVar116 * fVar106) ^
                                 uVar41);
            local_1148 = (float)((uint)(fVar118 * fVar89 + fVar46 * fVar42 + fVar96 * fVar125) ^
                                uVar38);
            fStack_1144 = (float)((uint)(fVar120 * fVar92 + fVar55 * fVar108 + fVar98 * fVar126) ^
                                 uVar39);
            fStack_1140 = (float)((uint)(fVar122 * fVar93 + fVar56 * fVar43 + fVar99 * fVar127) ^
                                 uVar40);
            fStack_113c = (float)((uint)(fVar124 * fVar94 + fVar57 * fVar44 + fVar106 * fVar128) ^
                                 uVar41);
            local_1128._0_4_ = ABS(fVar107);
            local_1128._4_4_ = ABS(fVar103);
            fStack_1120 = ABS(fVar104);
            fStack_111c = ABS(fVar105);
            auVar97._0_4_ =
                 -(uint)((0.0 <= (float)local_1158._0_4_ && 0.0 <= local_1148) && fVar107 != 0.0) &
                 local_1078 &
                 -(uint)((float)local_1158._0_4_ + local_1148 <= (float)local_1128._0_4_);
            auVar97._4_4_ =
                 -(uint)((0.0 <= (float)local_1158._4_4_ && 0.0 <= fStack_1144) && fVar103 != 0.0) &
                 uStack_1074 &
                 -(uint)((float)local_1158._4_4_ + fStack_1144 <= (float)local_1128._4_4_);
            auVar97._8_4_ =
                 -(uint)((0.0 <= fStack_1150 && 0.0 <= fStack_1140) && fVar104 != 0.0) & uStack_1070
                 & -(uint)(fStack_1150 + fStack_1140 <= fStack_1120);
            auVar97._12_4_ =
                 -(uint)((0.0 <= fStack_114c && 0.0 <= fStack_113c) && fVar105 != 0.0) & uStack_106c
                 & -(uint)(fStack_114c + fStack_113c <= fStack_111c);
            lVar17 = (uVar30 & 0xfffffffffffffff0) + lVar25;
            iVar22 = movmskps((int)lVar25,auVar97);
            if (iVar22 == 0) {
              uVar39 = 0;
            }
            else {
              local_1180 = context->scene;
              local_1138 = (float)(uVar38 ^ (uint)(local_ff8 * (float)local_10c8._0_4_ +
                                                  fVar117 * local_10b8[0] +
                                                  local_fe8 * local_10a8[0]));
              fStack_1134 = (float)(uVar39 ^ (uint)(fStack_ff4 * (float)local_10c8._4_4_ +
                                                   fVar119 * local_10b8[1] +
                                                   fStack_fe4 * local_10a8[1]));
              fStack_1130 = (float)(uVar40 ^ (uint)(fStack_ff0 * fStack_10c0 +
                                                   fVar121 * local_10b8[2] +
                                                   fStack_fe0 * local_10a8[2]));
              fStack_112c = (float)(uVar41 ^ (uint)(fStack_fec * fStack_10bc +
                                                   fVar123 * local_10b8[3] +
                                                   fStack_fdc * local_10a8[3]));
              fVar89 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar117 = (ray->super_RayK<1>).tfar;
              uVar38 = (ray->super_RayK<1>).mask;
              fVar92 = (float)(ray->super_RayK<1>).id;
              fVar119 = (float)(ray->super_RayK<1>).flags;
              auVar51._0_4_ =
                   -(uint)(fVar89 * (float)local_1128._0_4_ < local_1138 &&
                          local_1138 <= fVar117 * (float)local_1128._0_4_) & auVar97._0_4_;
              auVar51._4_4_ =
                   -(uint)(fVar89 * (float)local_1128._4_4_ < fStack_1134 &&
                          fStack_1134 <= fVar117 * (float)local_1128._4_4_) & auVar97._4_4_;
              auVar51._8_4_ =
                   -(uint)(fVar89 * fStack_1120 < fStack_1130 &&
                          fStack_1130 <= fVar117 * fStack_1120) & auVar97._8_4_;
              auVar51._12_4_ =
                   -(uint)(fVar89 * fStack_111c < fStack_112c &&
                          fStack_112c <= fVar117 * fStack_111c) & auVar97._12_4_;
              uVar39 = movmskps(iVar22,auVar51);
              if (uVar39 != 0) {
                local_1108 = auVar51;
                _local_1238 = auVar51;
                auVar18._4_4_ = local_1128._4_4_;
                auVar18._0_4_ = local_1128._0_4_;
                auVar18._8_4_ = fStack_1120;
                auVar18._12_4_ = fStack_111c;
                auVar58 = rcpps(_local_1168,auVar18);
                fVar89 = auVar58._0_4_;
                fVar93 = auVar58._4_4_;
                fVar121 = auVar58._8_4_;
                fVar94 = auVar58._12_4_;
                fVar89 = (1.0 - (float)local_1128._0_4_ * fVar89) * fVar89 + fVar89;
                fVar93 = (1.0 - (float)local_1128._4_4_ * fVar93) * fVar93 + fVar93;
                fVar121 = (1.0 - fStack_1120 * fVar121) * fVar121 + fVar121;
                fVar94 = (1.0 - fStack_111c * fVar94) * fVar94 + fVar94;
                local_1278 = local_1138 * fVar89;
                fStack_1274 = fStack_1134 * fVar93;
                fStack_1270 = fStack_1130 * fVar121;
                fStack_126c = fStack_112c * fVar94;
                local_10d8[0] = local_1278;
                local_10d8[1] = fStack_1274;
                local_10d8[2] = fStack_1270;
                local_10d8[3] = fStack_126c;
                local_10f8[0] = (float)local_1158._0_4_ * fVar89;
                local_10f8[1] = (float)local_1158._4_4_ * fVar93;
                local_10f8[2] = fStack_1150 * fVar121;
                local_10f8[3] = fStack_114c * fVar94;
                local_10e8._4_4_ = fVar93 * fStack_1144;
                local_10e8._0_4_ = fVar89 * local_1148;
                fStack_10e0 = fVar121 * fStack_1140;
                fStack_10dc = fVar94 * fStack_113c;
                auVar72._0_4_ = auVar51._0_4_ & (uint)local_1278;
                auVar72._4_4_ = auVar51._4_4_ & (uint)fStack_1274;
                auVar72._8_4_ = auVar51._8_4_ & (uint)fStack_1270;
                auVar72._12_4_ = auVar51._12_4_ & (uint)fStack_126c;
                auVar64._0_8_ = CONCAT44(~auVar51._4_4_,~auVar51._0_4_) & 0x7f8000007f800000;
                auVar64._8_4_ = ~auVar51._8_4_ & 0x7f800000;
                auVar64._12_4_ = ~auVar51._12_4_ & 0x7f800000;
                auVar64 = auVar64 | auVar72;
                auVar73._4_4_ = auVar64._0_4_;
                auVar73._0_4_ = auVar64._4_4_;
                auVar73._8_4_ = auVar64._12_4_;
                auVar73._12_4_ = auVar64._8_4_;
                auVar58 = minps(auVar73,auVar64);
                auVar81._0_8_ = auVar58._8_8_;
                auVar81._8_4_ = auVar58._0_4_;
                auVar81._12_4_ = auVar58._4_4_;
                auVar58 = minps(auVar81,auVar58);
                auVar82._0_8_ =
                     CONCAT44(-(uint)(auVar58._4_4_ == auVar64._4_4_) & auVar51._4_4_,
                              -(uint)(auVar58._0_4_ == auVar64._0_4_) & auVar51._0_4_);
                auVar82._8_4_ = -(uint)(auVar58._8_4_ == auVar64._8_4_) & auVar51._8_4_;
                auVar82._12_4_ = -(uint)(auVar58._12_4_ == auVar64._12_4_) & auVar51._12_4_;
                iVar22 = movmskps(uVar39,auVar82);
                if (iVar22 != 0) {
                  auVar51._8_4_ = auVar82._8_4_;
                  auVar51._0_8_ = auVar82._0_8_;
                  auVar51._12_4_ = auVar82._12_4_;
                }
                uVar23 = movmskps(iVar22,auVar51);
                uVar32 = CONCAT44((int)((ulong)lVar25 >> 0x20),uVar23);
                piVar33 = (int *)0x0;
                uVar40 = uVar38;
                if (uVar32 != 0) {
                  for (; (uVar32 >> (long)piVar33 & 1) == 0; piVar33 = (int *)((long)piVar33 + 1)) {
                  }
                }
LAB_00d0e76a:
                fVar75 = fStack_11bc;
                fVar84 = fStack_11c0;
                uVar39 = puVar35[(long)piVar33];
                auVar26 = (undefined1  [8])(ulong)uVar39;
                pGVar16 = (local_1180->geometries).items[(long)auVar26].ptr;
                if ((pGVar16->mask & uVar38) == 0) {
                  *(undefined4 *)(local_1238 + (long)piVar33 * 4) = 0;
                  goto LAB_00d0e7d7;
                }
                local_1268 = (Geometry *)local_1200->args;
                if (((RTCIntersectArguments *)local_1268)->filter == (RTCFilterFunctionN)0x0) {
                  pRVar29 = local_1200->user;
                  if (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar89 = local_10f8[(long)piVar33];
                    fVar117 = *(float *)(local_10e8 + (long)piVar33 * 4);
                    (ray->super_RayK<1>).tfar = local_10d8[(long)piVar33];
                    (ray->Ng).field_0.field_0.x = *(float *)(local_10c8 + (long)piVar33 * 4);
                    (ray->Ng).field_0.field_0.y = local_10b8[(long)piVar33];
                    (ray->Ng).field_0.field_0.z = local_10a8[(long)piVar33];
                    ray->u = fVar89;
                    ray->v = fVar117;
                    ray->primID = *(uint *)(lVar17 + 0x50 + (long)piVar33 * 4);
                    ray->geomID = uVar39;
                    ray->instID[0] = pRVar29->instID[0];
                    uVar39 = pRVar29->instPrimID[0];
                    ray->instPrimID[0] = uVar39;
LAB_00d0ef7a:
                    fStack_1210 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fStack_1260 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar83 = (ray->super_RayK<1>).org.field_0.m128[2];
                    local_1278 = (ray->super_RayK<1>).dir.field_0.m128[0];
                    fStack_1170 = (ray->super_RayK<1>).dir.field_0.m128[1];
                    local_1168._4_4_ = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
                    local_1218 = (RTCIntersectArguments *)CONCAT44(fStack_1210,fStack_1210);
                    fStack_120c = fStack_1210;
                    local_1268 = (Geometry *)CONCAT44(fStack_1260,fStack_1260);
                    fStack_125c = fStack_1260;
                    fStack_1274 = local_1278;
                    fStack_1270 = local_1278;
                    fStack_126c = local_1278;
                    local_1178 = (Geometry *)CONCAT44(fStack_1170,fStack_1170);
                    fStack_116c = fStack_1170;
                    local_1168._0_4_ = local_1168._4_4_;
                    fStack_1160 = (float)local_1168._4_4_;
                    fStack_115c = (float)local_1168._4_4_;
                    goto LAB_00d0e462;
                  }
                  fStack_1210 = fVar92;
                  fStack_120c = fVar119;
                }
                else {
                  fStack_1210 = fVar92;
                  fStack_120c = fVar119;
                  pRVar29 = local_1200->user;
                }
                local_1218 = (RTCIntersectArguments *)CONCAT44(uVar40,fVar117);
                local_11b8 = *(float *)(local_10c8 + (long)piVar33 * 4);
                local_11b4 = local_10b8[(long)piVar33];
                local_11b0 = local_10a8[(long)piVar33];
                local_11ac = local_10f8[(long)piVar33];
                local_11a8 = *(undefined4 *)(local_10e8 + (long)piVar33 * 4);
                local_11a4 = *(undefined4 *)(lVar17 + 0x50 + (long)piVar33 * 4);
                local_11a0 = uVar39;
                local_119c = pRVar29->instID[0];
                local_1198 = pRVar29->instPrimID[0];
                local_1168 = (undefined1  [8])piVar33;
                (ray->super_RayK<1>).tfar = local_10d8[(long)piVar33];
                local_127c = -1;
                local_11f8.valid = &local_127c;
                local_11f8.geometryUserPtr = pGVar16->userPtr;
                local_11f8.context = pRVar29;
                local_11f8.ray = (RTCRayN *)ray;
                local_11f8.hit = (RTCHitN *)&local_11b8;
                local_11f8.N = 1;
                fStack_1210 = fVar92;
                fStack_120c = fVar119;
                local_1178 = pGVar16;
                if (((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar16->intersectionFilterN)(&local_11f8), *local_11f8.valid != 0)) &&
                   ((((RTCIntersectArguments *)local_1268)->filter == (RTCFilterFunctionN)0x0 ||
                    ((((((RTCIntersectArguments *)local_1268)->flags &
                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                      && (((local_1178->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*((RTCIntersectArguments *)local_1268)->filter)(&local_11f8),
                     *local_11f8.valid != 0)))))) {
                  (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_11f8.hit;
                  (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_11f8.hit + 4);
                  (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_11f8.hit + 8);
                  *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                  *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                  *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                  *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                  *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                  *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                }
                else {
                  (ray->super_RayK<1>).tfar = (float)local_1218;
                }
                auVar26 = local_1168;
                *(undefined4 *)(local_1238 + (long)local_1168 * 4) = 0;
                fVar117 = (ray->super_RayK<1>).tfar;
                uVar40 = (ray->super_RayK<1>).mask;
                fVar92 = (float)(ray->super_RayK<1>).id;
                fVar119 = (float)(ray->super_RayK<1>).flags;
                local_1238._0_4_ = -(uint)(local_1278 <= fVar117) & local_1238._0_4_;
                local_1238._4_4_ = -(uint)(fStack_1274 <= fVar117) & local_1238._4_4_;
                uStack_1230 = -(uint)(fStack_1270 <= fVar117) & uStack_1230;
                uStack_122c = -(uint)(fStack_126c <= fVar117) & uStack_122c;
                uVar38 = (ray->super_RayK<1>).mask;
                fVar110 = (float)local_11c8;
                fVar112 = local_11c8._4_4_;
                fVar84 = fStack_11c0;
                fVar75 = fStack_11bc;
                fVar85 = (float)local_1248;
                fVar88 = local_1248._4_4_;
LAB_00d0e7d7:
                local_1268 = (Geometry *)CONCAT44(local_1268._4_4_,uVar38);
                uVar39 = movmskps(SUB84(auVar26,0),_local_1238);
                if (uVar39 == 0) goto LAB_00d0ef7a;
                fStack_1210 = fVar92;
                fStack_120c = fVar119;
                local_1218._0_4_ = fVar117;
                local_1218._4_4_ = (float)uVar40;
                BVHNIntersector1<4,1,false,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,true>>>
                ::intersect();
                piVar33 = local_11f8.valid;
                fVar110 = (float)local_11c8;
                fVar112 = local_11c8._4_4_;
                uVar38 = (uint)(float)local_1268;
                fVar117 = (float)local_1218;
                uVar40 = (uint)local_1218._4_4_;
                fVar92 = fStack_1210;
                fVar119 = fStack_120c;
                fVar85 = (float)local_1248;
                fVar88 = local_1248._4_4_;
                goto LAB_00d0e76a;
              }
            }
LAB_00d0e462:
            fVar89 = fVar85 - local_fd8;
            fVar92 = fVar88 - fStack_fd4;
            fVar93 = fStack_1240 - fStack_fd0;
            fVar94 = fStack_123c - fStack_fcc;
            fVar44 = fVar110 - local_fc8;
            fVar46 = fVar112 - fStack_fc4;
            fVar55 = fVar84 - fStack_fc0;
            fVar56 = fVar75 - fStack_fbc;
            fVar118 = (float)local_1258 - (float)local_fb8;
            fVar120 = local_1258._4_4_ - local_fb8._4_4_;
            fVar122 = (float)uStack_1250 - fStack_fb0;
            fVar124 = uStack_1250._4_4_ - fStack_fac;
            fVar113 = local_f88 - fVar85;
            fVar114 = fStack_f84 - fVar88;
            fVar115 = fStack_f80 - fStack_1240;
            fVar116 = fStack_f7c - fStack_123c;
            fVar103 = local_fa8 - fVar110;
            fVar104 = fStack_fa4 - fVar112;
            fVar109 = fStack_fa0 - fVar84;
            fVar111 = fStack_f9c - fVar75;
            fVar105 = (float)local_f98 - (float)local_1258;
            fVar42 = local_f98._4_4_ - local_1258._4_4_;
            fVar108 = fStack_f90 - (float)uStack_1250;
            fVar43 = fStack_f8c - uStack_1250._4_4_;
            local_10c8._0_4_ = fVar103 * fVar118 - fVar105 * fVar44;
            local_10c8._4_4_ = fVar104 * fVar120 - fVar42 * fVar46;
            fStack_10c0 = fVar109 * fVar122 - fVar108 * fVar55;
            fStack_10bc = fVar111 * fVar124 - fVar43 * fVar56;
            local_10b8[0] = fVar105 * fVar89 - fVar113 * fVar118;
            local_10b8[1] = fVar42 * fVar92 - fVar114 * fVar120;
            local_10b8[2] = fVar108 * fVar93 - fVar115 * fVar122;
            local_10b8[3] = fVar43 * fVar94 - fVar116 * fVar124;
            local_10a8[0] = fVar113 * fVar44 - fVar103 * fVar89;
            local_10a8[1] = fVar114 * fVar46 - fVar104 * fVar92;
            local_10a8[2] = fVar115 * fVar55 - fVar109 * fVar93;
            local_10a8[3] = fVar116 * fVar56 - fVar111 * fVar94;
            fVar85 = fVar85 - (float)local_1218;
            fVar88 = fVar88 - local_1218._4_4_;
            fStack_1240 = fStack_1240 - fStack_120c;
            fStack_123c = fStack_123c - fStack_120c;
            fVar110 = fVar110 - (float)local_1268;
            fVar112 = fVar112 - local_1268._4_4_;
            fStack_11c0 = fVar84 - fStack_125c;
            fStack_11bc = fVar75 - fStack_125c;
            local_1258._0_4_ = (float)local_1258 - fVar83;
            local_1258._4_4_ = local_1258._4_4_ - fVar83;
            uStack_1250._0_4_ = (float)uStack_1250 - fVar83;
            uStack_1250._4_4_ = uStack_1250._4_4_ - fVar83;
            fVar75 = fVar110 * (float)local_1168._0_4_ - (float)local_1258 * (float)local_1178;
            fVar83 = fVar112 * (float)local_1168._4_4_ - local_1258._4_4_ * local_1178._4_4_;
            fVar84 = fStack_11c0 * fStack_1160 - (float)uStack_1250 * fStack_116c;
            fVar57 = fStack_11bc * fStack_115c - uStack_1250._4_4_ * fStack_116c;
            fVar100 = (float)local_1258 * fStack_126c - fVar85 * (float)local_1168._0_4_;
            fVar101 = local_1258._4_4_ * fStack_126c - fVar88 * (float)local_1168._4_4_;
            fVar102 = (float)uStack_1250 * fStack_126c - fStack_1240 * fStack_1160;
            fVar107 = uStack_1250._4_4_ * fStack_126c - fStack_123c * fStack_115c;
            local_11c8 = (Scene *)CONCAT44(fVar112,fVar110);
            local_1248 = CONCAT44(fVar88,fVar85);
            fVar96 = fVar85 * (float)local_1178 - fVar110 * fStack_126c;
            fVar98 = fVar88 * local_1178._4_4_ - fVar112 * fStack_126c;
            fVar99 = fStack_1240 * fStack_116c - fStack_11c0 * fStack_126c;
            fVar106 = fStack_123c * fStack_116c - fStack_11bc * fStack_126c;
            fVar117 = fStack_126c * (float)local_10c8._0_4_ +
                      (float)local_1178 * local_10b8[0] + (float)local_1168._0_4_ * local_10a8[0];
            fVar119 = fStack_126c * (float)local_10c8._4_4_ +
                      local_1178._4_4_ * local_10b8[1] + (float)local_1168._4_4_ * local_10a8[1];
            fVar121 = fStack_126c * fStack_10c0 +
                      fStack_116c * local_10b8[2] + fStack_1160 * local_10a8[2];
            fVar123 = fStack_126c * fStack_10bc +
                      fStack_116c * local_10b8[3] + fStack_115c * local_10a8[3];
            uVar38 = (uint)fVar117 & 0x80000000;
            uVar40 = (uint)fVar119 & 0x80000000;
            uVar41 = (uint)fVar121 & 0x80000000;
            uVar45 = (uint)fVar123 & 0x80000000;
            fVar105 = (float)((uint)(fVar113 * fVar75 + fVar103 * fVar100 + fVar105 * fVar96) ^
                             uVar38);
            fVar42 = (float)((uint)(fVar114 * fVar83 + fVar104 * fVar101 + fVar42 * fVar98) ^ uVar40
                            );
            fVar108 = (float)((uint)(fVar115 * fVar84 + fVar109 * fVar102 + fVar108 * fVar99) ^
                             uVar41);
            fVar43 = (float)((uint)(fVar116 * fVar57 + fVar111 * fVar107 + fVar43 * fVar106) ^
                            uVar45);
            auVar80._0_4_ =
                 (float)((uint)(fVar75 * fVar89 + fVar100 * fVar44 + fVar96 * fVar118) ^ uVar38);
            auVar80._4_4_ =
                 (float)((uint)(fVar83 * fVar92 + fVar101 * fVar46 + fVar98 * fVar120) ^ uVar40);
            auVar80._8_4_ =
                 (float)((uint)(fVar84 * fVar93 + fVar102 * fVar55 + fVar99 * fVar122) ^ uVar41);
            auVar80._12_4_ =
                 (float)((uint)(fVar57 * fVar94 + fVar107 * fVar56 + fVar106 * fVar124) ^ uVar45);
            fVar89 = ABS(fVar117);
            fVar92 = ABS(fVar119);
            local_1128 = (undefined1  [8])(CONCAT44(fVar119,fVar117) & 0x7fffffff7fffffff);
            fStack_1120 = ABS(fVar121);
            fStack_111c = ABS(fVar123);
            auVar71._0_4_ =
                 -(uint)((0.0 <= fVar105 && 0.0 <= auVar80._0_4_) && fVar117 != 0.0) & local_1078 &
                 -(uint)(fVar105 + auVar80._0_4_ <= fVar89);
            auVar71._4_4_ =
                 -(uint)((0.0 <= fVar42 && 0.0 <= auVar80._4_4_) && fVar119 != 0.0) & uStack_1074 &
                 -(uint)(fVar42 + auVar80._4_4_ <= fVar92);
            auVar71._8_4_ =
                 -(uint)((0.0 <= fVar108 && 0.0 <= auVar80._8_4_) && fVar121 != 0.0) & uStack_1070 &
                 -(uint)(fVar108 + auVar80._8_4_ <= fStack_1120);
            auVar71._12_4_ =
                 -(uint)((0.0 <= fVar43 && 0.0 <= auVar80._12_4_) && fVar123 != 0.0) & uStack_106c &
                 -(uint)(fVar43 + auVar80._12_4_ <= fStack_111c);
            iVar22 = movmskps(uVar39,auVar71);
            if (iVar22 != 0) {
              local_1138 = (float)(uVar38 ^ (uint)(fVar85 * (float)local_10c8._0_4_ +
                                                  fVar110 * local_10b8[0] +
                                                  (float)local_1258 * local_10a8[0]));
              fStack_1134 = (float)(uVar40 ^ (uint)(fVar88 * (float)local_10c8._4_4_ +
                                                   fVar112 * local_10b8[1] +
                                                   local_1258._4_4_ * local_10a8[1]));
              fStack_1130 = (float)(uVar41 ^ (uint)(fStack_1240 * fStack_10c0 +
                                                   fStack_11c0 * local_10b8[2] +
                                                   (float)uStack_1250 * local_10a8[2]));
              fStack_112c = (float)(uVar45 ^ (uint)(fStack_123c * fStack_10bc +
                                                   fStack_11bc * local_10b8[3] +
                                                   uStack_1250._4_4_ * local_10a8[3]));
              fVar117 = (ray->super_RayK<1>).org.field_0.m128[3];
              local_1278 = (ray->super_RayK<1>).tfar;
              fStack_1274 = (float)(ray->super_RayK<1>).mask;
              fStack_1270 = (float)(ray->super_RayK<1>).id;
              fStack_126c = (float)(ray->super_RayK<1>).flags;
              auVar95._0_4_ =
                   -(uint)(local_1138 <= local_1278 * fVar89 && fVar117 * fVar89 < local_1138) &
                   auVar71._0_4_;
              auVar95._4_4_ =
                   -(uint)(fStack_1134 <= local_1278 * fVar92 && fVar117 * fVar92 < fStack_1134) &
                   auVar71._4_4_;
              auVar95._8_4_ =
                   -(uint)(fStack_1130 <= local_1278 * fStack_1120 &&
                          fVar117 * fStack_1120 < fStack_1130) & auVar71._8_4_;
              auVar95._12_4_ =
                   -(uint)(fStack_112c <= local_1278 * fStack_111c &&
                          fVar117 * fStack_111c < fStack_112c) & auVar71._12_4_;
              iVar22 = movmskps(iVar22,auVar95);
              if (iVar22 != 0) {
                local_1108 = auVar95;
                local_1158._4_4_ = fVar92 - fVar42;
                local_1158._0_4_ = fVar89 - fVar105;
                fStack_1150 = fStack_1120 - fVar108;
                fStack_114c = fStack_111c - fVar43;
                local_1148 = fVar89 - auVar80._0_4_;
                fStack_1144 = fVar92 - auVar80._4_4_;
                fStack_1140 = fStack_1120 - auVar80._8_4_;
                fStack_113c = fStack_111c - auVar80._12_4_;
                _local_1238 = auVar95;
                auVar58 = rcpps(auVar80,_local_1128);
                fVar117 = auVar58._0_4_;
                fVar85 = auVar58._4_4_;
                fVar110 = auVar58._8_4_;
                fVar119 = auVar58._12_4_;
                fVar117 = (1.0 - fVar89 * fVar117) * fVar117 + fVar117;
                fVar85 = (1.0 - fVar92 * fVar85) * fVar85 + fVar85;
                fVar110 = (1.0 - fStack_1120 * fVar110) * fVar110 + fVar110;
                fVar119 = (1.0 - fStack_111c * fVar119) * fVar119 + fVar119;
                local_1248._0_4_ = local_1138 * fVar117;
                local_1248._4_4_ = fStack_1134 * fVar85;
                local_10d8[2] = fStack_1130 * fVar110;
                local_10d8[3] = fStack_112c * fVar119;
                local_10d8[0] = (float)local_1248;
                local_10d8[1] = local_1248._4_4_;
                local_10f8[0] = (fVar89 - fVar105) * fVar117;
                local_10f8[1] = (fVar92 - fVar42) * fVar85;
                local_10f8[2] = (fStack_1120 - fVar108) * fVar110;
                local_10f8[3] = (fStack_111c - fVar43) * fVar119;
                local_10e8._0_4_ = fVar117 * (fVar89 - auVar80._0_4_);
                local_10e8._4_4_ = fVar85 * (fVar92 - auVar80._4_4_);
                fStack_10e0 = fVar110 * (fStack_1120 - auVar80._8_4_);
                fStack_10dc = fVar119 * (fStack_111c - auVar80._12_4_);
                auVar52._0_4_ = auVar95._0_4_ & (uint)(float)local_1248;
                auVar52._4_4_ = auVar95._4_4_ & (uint)local_1248._4_4_;
                auVar52._8_4_ = auVar95._8_4_ & (uint)local_10d8[2];
                auVar52._12_4_ = auVar95._12_4_ & (uint)local_10d8[3];
                auVar65._0_8_ = CONCAT44(~auVar95._4_4_,~auVar95._0_4_) & 0x7f8000007f800000;
                auVar65._8_4_ = ~auVar95._8_4_ & 0x7f800000;
                auVar65._12_4_ = ~auVar95._12_4_ & 0x7f800000;
                auVar65 = auVar65 | auVar52;
                auVar74._4_4_ = auVar65._0_4_;
                auVar74._0_4_ = auVar65._4_4_;
                auVar74._8_4_ = auVar65._12_4_;
                auVar74._12_4_ = auVar65._8_4_;
                auVar58 = minps(auVar74,auVar65);
                auVar53._0_8_ = auVar58._8_8_;
                auVar53._8_4_ = auVar58._0_4_;
                auVar53._12_4_ = auVar58._4_4_;
                auVar58 = minps(auVar53,auVar58);
                auVar54._0_8_ =
                     CONCAT44(-(uint)(auVar58._4_4_ == auVar65._4_4_) & auVar95._4_4_,
                              -(uint)(auVar58._0_4_ == auVar65._0_4_) & auVar95._0_4_);
                auVar54._8_4_ = -(uint)(auVar58._8_4_ == auVar65._8_4_) & auVar95._8_4_;
                auVar54._12_4_ = -(uint)(auVar58._12_4_ == auVar65._12_4_) & auVar95._12_4_;
                iVar22 = movmskps((int)local_1200,auVar54);
                if (iVar22 != 0) {
                  auVar95._8_4_ = auVar54._8_4_;
                  auVar95._0_8_ = auVar54._0_8_;
                  auVar95._12_4_ = auVar54._12_4_;
                }
                uVar23 = movmskps(iVar22,auVar95);
                piVar27 = (int *)CONCAT44((int)((ulong)local_1200 >> 0x20),uVar23);
                piVar33 = (int *)0x0;
                if (piVar27 != (int *)0x0) {
                  for (; ((ulong)piVar27 >> (long)piVar33 & 1) == 0;
                      piVar33 = (int *)((long)piVar33 + 1)) {
                  }
                }
                local_11c8 = local_1200->scene;
                fVar89 = local_10d8[2];
                fVar117 = local_10d8[3];
                uVar38 = (uint)fStack_1274;
                fStack_1260 = fStack_125c;
                fStack_1210 = fStack_120c;
                fStack_1170 = fStack_116c;
                do {
                  uVar39 = puVar35[(long)piVar33];
                  local_1258 = (int *)(ulong)uVar39;
                  pGVar16 = (local_11c8->geometries).items[(long)(ulong)uVar39].ptr;
                  if ((pGVar16->mask & uVar38) == 0) {
                    *(undefined4 *)(local_1238 + (long)piVar33 * 4) = 0;
                  }
                  else {
                    local_1218 = local_1200->args;
                    if (local_1200->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar29 = local_1200->user;
                      if (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar89 = local_10f8[(long)piVar33];
                        fVar117 = *(float *)(local_10e8 + (long)piVar33 * 4);
                        (ray->super_RayK<1>).tfar = local_10d8[(long)piVar33];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_10c8 + (long)piVar33 * 4);
                        (ray->Ng).field_0.field_0.y = local_10b8[(long)piVar33];
                        (ray->Ng).field_0.field_0.z = local_10a8[(long)piVar33];
                        ray->u = fVar89;
                        ray->v = fVar117;
                        ray->primID = *(uint *)(lVar17 + 0x50 + (long)piVar33 * 4);
                        ray->geomID = uVar39;
                        ray->instID[0] = pRVar29->instID[0];
                        ray->instPrimID[0] = pRVar29->instPrimID[0];
                        break;
                      }
                      local_1268 = pGVar16;
                      fStack_1240 = fVar89;
                      fStack_123c = fVar117;
                    }
                    else {
                      local_1268 = pGVar16;
                      fStack_1240 = fVar89;
                      fStack_123c = fVar117;
                      pRVar29 = local_1200->user;
                    }
                    local_11b8 = *(float *)(local_10c8 + (long)piVar33 * 4);
                    local_11b4 = local_10b8[(long)piVar33];
                    local_11b0 = local_10a8[(long)piVar33];
                    local_11ac = local_10f8[(long)piVar33];
                    local_11a8 = *(undefined4 *)(local_10e8 + (long)piVar33 * 4);
                    local_11a4 = *(undefined4 *)(lVar17 + 0x50 + (long)piVar33 * 4);
                    local_11a0 = uVar39;
                    local_119c = pRVar29->instID[0];
                    local_1198 = pRVar29->instPrimID[0];
                    local_1258 = piVar33;
                    (ray->super_RayK<1>).tfar = local_10d8[(long)piVar33];
                    local_127c = -1;
                    local_11f8.valid = &local_127c;
                    local_11f8.geometryUserPtr = pGVar16->userPtr;
                    local_11f8.context = pRVar29;
                    local_11f8.ray = (RTCRayN *)ray;
                    local_11f8.hit = (RTCHitN *)&local_11b8;
                    local_11f8.N = 1;
                    local_1268 = pGVar16;
                    fStack_1240 = fVar89;
                    fStack_123c = fVar117;
                    if (((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar16->intersectionFilterN)(&local_11f8), *local_11f8.valid != 0)) &&
                       (((local_1218->filter == (RTCFilterFunctionN)0x0 ||
                         (((local_1218->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1268->field_8).field_0x2 & 0x40) == 0)))) ||
                        ((*local_1218->filter)(&local_11f8), *local_11f8.valid != 0)))) {
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11f8.hit;
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11f8.hit + 4);
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11f8.hit + 8);
                      *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                      *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                      *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                      *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                      *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                      *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = local_1278;
                    }
                    *(undefined4 *)(local_1238 + (long)local_1258 * 4) = 0;
                    local_1278 = (ray->super_RayK<1>).tfar;
                    fStack_1274 = (float)(ray->super_RayK<1>).mask;
                    fStack_1270 = (float)(ray->super_RayK<1>).id;
                    fStack_126c = (float)(ray->super_RayK<1>).flags;
                    local_1238._0_4_ = -(uint)((float)local_1248 <= local_1278) & local_1238._0_4_;
                    local_1238._4_4_ = -(uint)(local_1248._4_4_ <= local_1278) & local_1238._4_4_;
                    uStack_1230 = -(uint)(fStack_1240 <= local_1278) & uStack_1230;
                    uStack_122c = -(uint)(fStack_123c <= local_1278) & uStack_122c;
                    uVar38 = (ray->super_RayK<1>).mask;
                    piVar27 = local_1258;
                    fVar89 = fStack_1240;
                    fVar117 = fStack_123c;
                  }
                  local_1258 = (int *)CONCAT44(local_1258._4_4_,uVar38);
                  iVar22 = movmskps((int)piVar27,_local_1238);
                  if (iVar22 == 0) break;
                  fStack_1240 = fVar89;
                  fStack_123c = fVar117;
                  BVHNIntersector1<4,1,false,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar27 = extraout_RAX;
                  piVar33 = local_11f8.valid;
                  fVar89 = fStack_1240;
                  fVar117 = fStack_123c;
                  uVar38 = (uint)(float)local_1258;
                } while( true );
              }
            }
            local_1090 = local_1090 + 1;
            context = local_1200;
          } while (local_1090 != local_1098);
        }
        fVar110 = (ray->super_RayK<1>).tfar;
        uVar32 = local_1220;
        fVar92 = fVar110;
        fVar119 = fVar110;
        fVar121 = fVar110;
        fVar88 = local_1008;
        fVar112 = fStack_1004;
        fVar94 = fStack_1000;
        fVar85 = fStack_ffc;
        fVar123 = local_1018;
        fVar75 = fStack_1014;
        fVar83 = fStack_1010;
        fVar93 = fStack_100c;
        fVar105 = local_1028;
        fVar84 = fStack_1024;
        fVar42 = fStack_1020;
        fVar108 = fStack_101c;
        fVar43 = local_1038;
        fVar44 = fStack_1034;
        fVar46 = fStack_1030;
        fVar89 = fStack_102c;
        fVar55 = local_1048;
        fVar56 = fStack_1044;
        fVar57 = fStack_1040;
        fVar117 = fStack_103c;
        fVar96 = local_1058;
        fVar98 = fStack_1054;
        fVar99 = fStack_1050;
        fVar106 = fStack_104c;
        fVar100 = local_1068;
        fVar101 = fStack_1064;
        fVar102 = fStack_1060;
        fVar107 = fStack_105c;
      }
    } while (pauVar24 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }